

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ItemSimilarityRecommender::InternalSwap
          (ItemSimilarityRecommender *this,ItemSimilarityRecommender *other)

{
  ItemSimilarityRecommender *other_local;
  ItemSimilarityRecommender *this_local;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->itemitemsimilarities_).super_RepeatedPtrFieldBase,
             &(other->itemitemsimilarities_).super_RepeatedPtrFieldBase);
  std::swap<std::__cxx11::string*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             &this->iteminputfeaturename_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             &other->iteminputfeaturename_);
  std::swap<std::__cxx11::string*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             &this->numrecommendationsinputfeaturename_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             &other->numrecommendationsinputfeaturename_);
  std::swap<std::__cxx11::string*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             &this->itemrestrictioninputfeaturename_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             &other->itemrestrictioninputfeaturename_);
  std::swap<std::__cxx11::string*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             &this->itemexclusioninputfeaturename_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             &other->itemexclusioninputfeaturename_);
  std::swap<std::__cxx11::string*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             &this->recommendeditemlistoutputfeaturename_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             &other->recommendeditemlistoutputfeaturename_);
  std::swap<std::__cxx11::string*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             &this->recommendeditemscoreoutputfeaturename_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             &other->recommendeditemscoreoutputfeaturename_);
  std::swap<CoreML::Specification::StringVector*>(&this->itemstringids_,&other->itemstringids_);
  std::swap<CoreML::Specification::Int64Vector*>(&this->itemint64ids_,&other->itemint64ids_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void ItemSimilarityRecommender::InternalSwap(ItemSimilarityRecommender* other) {
  itemitemsimilarities_.InternalSwap(&other->itemitemsimilarities_);
  iteminputfeaturename_.Swap(&other->iteminputfeaturename_);
  numrecommendationsinputfeaturename_.Swap(&other->numrecommendationsinputfeaturename_);
  itemrestrictioninputfeaturename_.Swap(&other->itemrestrictioninputfeaturename_);
  itemexclusioninputfeaturename_.Swap(&other->itemexclusioninputfeaturename_);
  recommendeditemlistoutputfeaturename_.Swap(&other->recommendeditemlistoutputfeaturename_);
  recommendeditemscoreoutputfeaturename_.Swap(&other->recommendeditemscoreoutputfeaturename_);
  std::swap(itemstringids_, other->itemstringids_);
  std::swap(itemint64ids_, other->itemint64ids_);
  std::swap(_cached_size_, other->_cached_size_);
}